

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void undo_cmd_do_undo_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_58;
  undefined1 local_50 [8];
  Am_Object_Method method;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object last_command;
  Am_Object undo_handler;
  Am_Object *cmd_local;
  
  Am_Object::Am_Object(&last_command);
  Am_Object::Am_Object(&local_20);
  Am_Object::Am_Object((Am_Object *)&method.Call,cmd);
  get_undo_handler_from_cmd(local_38);
  Am_Object::operator=(&last_command,local_38);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object((Am_Object *)&method.Call);
  bVar1 = Am_Object::Valid(&last_command);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&last_command,0x178,0);
    Am_Object::operator=(&local_20,pAVar2);
    bVar1 = Am_Object::Valid(&local_20);
    if (bVar1) {
      Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_50);
      pAVar2 = Am_Object::Get(&last_command,0x176,0);
      Am_Object_Method::operator=((Am_Object_Method *)local_50,pAVar2);
      Am_Object::Am_Object(&local_58,&last_command);
      (*(code *)method.from_wrapper)(&local_58);
      Am_Object::~Am_Object(&local_58);
    }
  }
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&last_command);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, undo_cmd_do_undo, (Am_Object cmd))
{
  Am_Object undo_handler, last_command;
  undo_handler = get_undo_handler_from_cmd(cmd);
  if (undo_handler.Valid()) {
    last_command = undo_handler.Get(Am_UNDO_ALLOWED);
    if (last_command.Valid()) {
      Am_Object_Method method;
      method = undo_handler.Get(Am_PERFORM_UNDO);
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Undoing command "
                                                     << last_command);
      method.Call(undo_handler);
    }
  }
}